

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

bool re2::PCRE::Replace(string *str,PCRE *pattern,StringPiece *rewrite)

{
  bool bVar1;
  int veclen;
  int startpos;
  StringPiece *text;
  int *in_R9;
  string s;
  int vec [51];
  string local_128;
  StringPiece local_108;
  int local_f8 [54];
  
  bVar1 = false;
  text = (StringPiece *)0x0;
  memset(local_f8,0,0xcc);
  veclen = TryMatch(pattern,text,startpos,UNANCHORED,false,in_R9,0x33);
  if (veclen != 0) {
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_108.ptr_ = (str->_M_dataplus)._M_p;
    local_108.length_ = (int)str->_M_string_length;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    bVar1 = Rewrite(pattern,&local_128,rewrite,&local_108,local_f8,veclen);
    if (bVar1) {
      std::__cxx11::string::replace((ulong)str,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  return bVar1;
}

Assistant:

bool PCRE::Replace(string *str,
                 const PCRE& pattern,
                 const StringPiece& rewrite) {
  int vec[kVecSize] = {};
  int matches = pattern.TryMatch(*str, 0, UNANCHORED, true, vec, kVecSize);
  if (matches == 0)
    return false;

  string s;
  if (!pattern.Rewrite(&s, rewrite, *str, vec, matches))
    return false;

  assert(vec[0] >= 0);
  assert(vec[1] >= 0);
  str->replace(vec[0], vec[1] - vec[0], s);
  return true;
}